

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::keccak_tests::test_method(keccak_tests *this)

{
  long lVar1;
  int j;
  long lVar2;
  iterator in_R8;
  iterator in_R9;
  int i;
  int iVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  char *local_208;
  char *local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  string local_1b8;
  uint256 out;
  CSHA256 tester;
  uint64_t state [25];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&state,0,200);
  CSHA256::CSHA256(&tester);
  for (iVar3 = 0; iVar3 != 0x40000; iVar3 = iVar3 + 1) {
    KeccakF(&state);
    for (lVar2 = 0; lVar2 != 0x19; lVar2 = lVar2 + 1) {
      out.super_base_blob<256U>.m_data._M_elems._0_8_ = state[lVar2];
      CSHA256::Write(&tester,(uchar *)&out,8);
    }
  }
  out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::Finalize(&tester,(uchar *)&out);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x468;
  file.m_begin = (iterator)&local_1c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_011480b0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_200 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_1b8,(base_blob<256u> *)&out);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (&local_1f8,&local_208,0x468,1,2,&local_1b8,"out.ToString()",
             "5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f",
             "\"5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f\"");
  std::__cxx11::string::~string((string *)&local_1b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(keccak_tests)
{
    // Start with the zero state.
    uint64_t state[25] = {0};
    CSHA256 tester;
    for (int i = 0; i < 262144; ++i) {
        KeccakF(state);
        for (int j = 0; j < 25; ++j) {
            unsigned char buf[8];
            WriteLE64(buf, state[j]);
            tester.Write(buf, 8);
        }
    }
    uint256 out;
    tester.Finalize(out.begin());
    // Expected hash of the concatenated serialized states after 1...262144 iterations of KeccakF.
    // Verified against an independent implementation.
    BOOST_CHECK_EQUAL(out.ToString(), "5f4a7f2eca7d57740ef9f1a077b4fc67328092ec62620447fe27ad8ed5f7e34f");
}